

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

bool __thiscall helics::CommonCore::checkForLocalPublication(CommonCore *this,ActionMessage *cmd)

{
  string_view string2;
  InterfaceHandle IVar1;
  GlobalFederateId GVar2;
  BasicHandleInfo *this_00;
  long in_RSI;
  BasicHandleInfo *in_RDI;
  __sv_type string1;
  ActionMessage notice;
  BasicHandleInfo *pub;
  ActionMessage *in_stack_00000158;
  CommonCore *in_stack_00000160;
  CommonCore *this_01;
  undefined1 in_stack_fffffffffffffed8 [16];
  undefined1 auVar3 [12];
  string_view in_stack_fffffffffffffee8;
  
  auVar3 = in_stack_fffffffffffffed8._4_12_;
  this_01 = (CommonCore *)&in_RDI[0xc].type._M_string_length;
  ActionMessage::name((ActionMessage *)0x5590ec);
  this_00 = HandleManager::getInterfaceHandle(auVar3._4_8_,in_stack_fffffffffffffee8,auVar3[3]);
  if (this_00 != (BasicHandleInfo *)0x0) {
    IVar1 = BasicHandleInfo::getInterfaceHandle(this_00);
    *(BaseType *)(in_RSI + 0x14) = IVar1.hid;
    GVar2 = BasicHandleInfo::getFederateId(this_00);
    *(BaseType *)(in_RSI + 0x10) = GVar2.gid;
    setAsUsed(this_01,in_RDI);
    routeMessage(in_stack_00000160,in_stack_00000158);
    ActionMessage::ActionMessage(auVar3._4_8_,auVar3._0_4_);
    GVar2 = BasicHandleInfo::getFederateId(this_00);
    IVar1 = BasicHandleInfo::getInterfaceHandle(this_00);
    std::__cxx11::string::operator_cast_to_basic_string_view
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(GVar2.gid,IVar1.hid));
    string1 = std::__cxx11::string::operator_cast_to_basic_string_view
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(GVar2.gid,IVar1.hid));
    string2._M_str = (char *)this_01;
    string2._M_len = (size_t)in_RDI;
    ActionMessage::setStringData
              ((ActionMessage *)CONCAT44(GVar2.gid,IVar1.hid),(string_view)string1,string2);
    routeMessage(in_stack_00000160,in_stack_00000158);
    ActionMessage::~ActionMessage((ActionMessage *)CONCAT44(GVar2.gid,IVar1.hid));
  }
  return this_00 != (BasicHandleInfo *)0x0;
}

Assistant:

bool CommonCore::checkForLocalPublication(ActionMessage& cmd)
{
    auto* pub = loopHandles.getInterfaceHandle(cmd.name(), InterfaceType::PUBLICATION);
    if (pub != nullptr) {
        // now send the same command to the publication
        cmd.dest_handle = pub->getInterfaceHandle();
        cmd.dest_id = pub->getFederateId();
        setAsUsed(pub);
        // send to
        routeMessage(cmd);
        // now send the notification to the subscription in the federateState
        ActionMessage notice(CMD_ADD_PUBLISHER);
        notice.dest_id = cmd.source_id;
        notice.dest_handle = cmd.source_handle;
        notice.source_id = pub->getFederateId();
        notice.source_handle = pub->getInterfaceHandle();
        notice.setStringData(pub->type, pub->units);
        routeMessage(notice);
        return true;
    }
    return false;
}